

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_LoadFactor_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_> *this_00;
  pointer piVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  float grow;
  float fVar5;
  size_t bucket_count;
  pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  p;
  float shrink_threshold;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  int local_f8;
  hasher local_f0;
  float local_e4;
  pair<google::dense_hashtable_iterator<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_e0;
  AssertHelper local_c0;
  float local_b4;
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  local_e4 = 0.2;
  this_00 = &local_b0.
             super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_;
  do {
    local_f0.id_ = 0;
    local_f0.num_hashes_ = 0;
    local_f0.num_compares_ = 0;
    local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_f8 = 0;
    local_e0.first.ht._0_4_ = 0;
    local_e0.first.pos = (pointer)0x0;
    google::
    HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashSet
              (&local_b0,0,&local_f0,(key_equal *)&local_100,(allocator_type *)&local_e0);
    iVar2 = UniqueObjectHelper<int>(1);
    google::
    dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::squash_deleted(&this_00->rep);
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.use_deleted_ = true
    ;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
         local_e4 * 0.5;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ =
         local_e4;
    fVar5 = local_e4 *
            (float)local_b0.
                   super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_
         = (size_type)fVar5;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_
         = (long)(fVar5 - 9.223372e+18) &
           (long)local_b0.
                 super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                 enlarge_threshold_ >> 0x3f |
           local_b0.
           super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
           enlarge_threshold_;
    if (0.0 <= local_b0.
               super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_factor_) {
      local_b0.
      super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
           0.0;
    }
    fVar5 = local_b0.
            super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
            shrink_factor_ *
            (float)local_b0.
                   super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
         (size_type)fVar5;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
         (long)(fVar5 - 9.223372e+18) &
         (long)local_b0.
               super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_threshold_ >> 0x3f |
         local_b0.
         super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
         shrink_threshold_;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
         false;
    local_f0.id_ = (int)local_e4;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.key_info.delkey = iVar2;
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_e0,"grow_threshold","ht.max_load_factor()",&local_e4,
               (float *)&local_f0);
    if ((char)local_e0.first.ht == '\0') {
      testing::Message::Message((Message *)&local_f0);
      pcVar4 = "";
      if (local_e0.first.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e0.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x269,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if ((long *)local_f0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_f0._0_8_ + 8))();
      }
    }
    piVar1 = local_e0.first.pos;
    if (local_e0.first.pos != (pointer)0x0) {
      if (*(pointer *)local_e0.first.pos != local_e0.first.pos + 4) {
        operator_delete(*(pointer *)local_e0.first.pos);
      }
      operator_delete(piVar1);
    }
    local_f0._0_8_ = (long *)0x0;
    local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_100._4_4_,
                         local_b0.
                         super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         .ht_.rep.settings.
                         super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_);
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_e0,"0.0","ht.min_load_factor()",(double *)&local_f0,
               (float *)&local_100);
    if ((char)local_e0.first.ht == '\0') {
      testing::Message::Message((Message *)&local_f0);
      pcVar4 = "";
      if (local_e0.first.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e0.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_100,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x26a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_100,(Message *)&local_f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_100);
      if ((long *)local_f0._0_8_ != (long *)0x0) {
        (**(code **)(*(long *)local_f0._0_8_ + 8))();
      }
    }
    piVar1 = local_e0.first.pos;
    if (local_e0.first.pos != (pointer)0x0) {
      if (*(pointer *)local_e0.first.pos != local_e0.first.pos + 4) {
        operator_delete(*(pointer *)local_e0.first.pos);
      }
      operator_delete(piVar1);
    }
    google::
    dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize(&this_00->rep,0x4098);
    local_f0.id_ = (undefined4)
                   local_b0.
                   super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_f0.num_hashes_ =
         local_b0.
         super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets._4_4_;
    iVar2 = UniqueObjectHelper<int>(2);
    local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_100._4_4_,iVar2);
    google::
    dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::resize_delta(&this_00->rep,1);
    google::
    dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
    ::insert_noresize<int_const&,int_const&>
              (&local_e0,
               (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                *)this_00,(int *)&local_100,(int *)&local_100);
    local_e0.first.ht._0_4_ = UniqueObjectHelper<int>(2);
    google::
    dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::erase(&this_00->rep,(key_type *)&local_e0);
    iVar2 = 2;
    while( true ) {
      iVar3 = UniqueObjectHelper<int>(iVar2);
      local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(local_100._4_4_,iVar3);
      google::
      dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta(&this_00->rep,1);
      google::
      dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
      ::insert_noresize<int_const&,int_const&>
                (&local_e0,
                 (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                  *)this_00,(int *)&local_100,(int *)&local_100);
      if (local_e4 <=
          (float)(local_b0.
                  super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.num_elements -
                 local_b0.
                 super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.num_deleted) / (float)(ulong)local_f0._0_8_) break;
      local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_b0.
                  super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.num_buckets;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_e0,"bucket_count","ht.bucket_count()",(unsigned_long *)&local_f0
                 ,(unsigned_long *)&local_100);
      if ((char)local_e0.first.ht == '\0') {
        testing::Message::Message((Message *)&local_100);
        pcVar4 = "";
        if (local_e0.first.pos != (pointer)0x0) {
          pcVar4 = *(char **)local_e0.first.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x275,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_100 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100 + 8))();
        }
      }
      piVar1 = local_e0.first.pos;
      if (local_e0.first.pos != (pointer)0x0) {
        if (*(pointer *)local_e0.first.pos != local_e0.first.pos + 4) {
          operator_delete(*(pointer *)local_e0.first.pos);
        }
        operator_delete(piVar1);
      }
      iVar2 = iVar2 + 1;
    }
    local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_b0.
                super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.num_buckets;
    testing::internal::CmpHelperGT<unsigned_long,unsigned_long>
              ((internal *)&local_e0,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_100,
               (unsigned_long *)&local_f0);
    if ((char)local_e0.first.ht == '\0') {
      testing::Message::Message((Message *)&local_100);
      pcVar4 = "";
      if (local_e0.first.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e0.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x277,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_100 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100 + 8))();
      }
    }
    piVar1 = local_e0.first.pos;
    if (local_e0.first.pos != (pointer)0x0) {
      if (*(pointer *)local_e0.first.pos != local_e0.first.pos + 4) {
        operator_delete(*(pointer *)local_e0.first.pos);
      }
      operator_delete(piVar1);
    }
    fVar5 = (float)local_b0.
                   super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_b4 = (float)(local_b0.
                       super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       .ht_.rep.num_elements -
                      local_b0.
                      super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      .ht_.rep.num_deleted) / fVar5 + -0.01;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
         0.5;
    if (local_b4 <= 0.5) {
      local_b0.
      super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_ =
           local_b4;
    }
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_factor_ =
         1.0;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.enlarge_threshold_
         = (long)(fVar5 - 9.223372e+18) & (long)fVar5 >> 0x3f | (long)fVar5;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
         (size_type)
         (local_b0.
          super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
          shrink_factor_ * fVar5);
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_threshold_ =
         (long)(local_b0.
                super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
                shrink_factor_ * fVar5 - 9.223372e+18) &
         (long)local_b0.
               super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
               .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
               shrink_threshold_ >> 0x3f |
         local_b0.
         super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.
         shrink_threshold_;
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    .ht_.rep.settings.super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.consider_shrink_ =
         false;
    local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &DAT_3ff0000000000000;
    local_c0.data_._0_4_ = 0x3f800000;
    testing::internal::CmpHelperEQ<double,float>
              ((internal *)&local_e0,"1.0","ht.max_load_factor()",(double *)&local_100,
               (float *)&local_c0);
    if ((char)local_e0.first.ht == '\0') {
      testing::Message::Message((Message *)&local_100);
      pcVar4 = "";
      if (local_e0.first.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e0.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x282,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_100 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100 + 8))();
      }
    }
    piVar1 = local_e0.first.pos;
    if (local_e0.first.pos != (pointer)0x0) {
      if (*(pointer *)local_e0.first.pos != local_e0.first.pos + 4) {
        operator_delete(*(pointer *)local_e0.first.pos);
      }
      operator_delete(piVar1);
    }
    local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_100._4_4_,
                         local_b0.
                         super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         .ht_.rep.settings.
                         super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.shrink_factor_);
    testing::internal::CmpHelperEQ<float,float>
              ((internal *)&local_e0,"shrink_threshold","ht.min_load_factor()",&local_b4,
               (float *)&local_100);
    if ((char)local_e0.first.ht == '\0') {
      testing::Message::Message((Message *)&local_100);
      pcVar4 = "";
      if (local_e0.first.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e0.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x283,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_100 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100 + 8))();
      }
    }
    piVar1 = local_e0.first.pos;
    if (local_e0.first.pos != (pointer)0x0) {
      if (*(pointer *)local_e0.first.pos != local_e0.first.pos + 4) {
        operator_delete(*(pointer *)local_e0.first.pos);
      }
      operator_delete(piVar1);
    }
    local_f0.id_ = (undefined4)
                   local_b0.
                   super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   .ht_.rep.num_buckets;
    local_f0.num_hashes_ =
         local_b0.
         super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         .ht_.rep.num_buckets._4_4_;
    iVar2 = 2;
    while( true ) {
      local_e0.first.ht._0_4_ = UniqueObjectHelper<int>(iVar2);
      google::
      dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&this_00->rep,(key_type *)&local_e0);
      iVar2 = iVar2 + 1;
      local_e0.first.ht._0_4_ = UniqueObjectHelper<int>(iVar2);
      google::
      dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::erase(&this_00->rep,(key_type *)&local_e0);
      iVar3 = UniqueObjectHelper<int>(iVar2);
      local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  CONCAT44(local_100._4_4_,iVar3);
      google::
      dense_hashtable<int,_int,_Hasher,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
      ::resize_delta(&this_00->rep,1);
      google::
      dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
      ::insert_noresize<int_const&,int_const&>
                (&local_e0,
                 (dense_hashtable<int,int,Hasher,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::Identity,google::dense_hash_set<int,Hasher,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>::SetKey,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
                  *)this_00,(int *)&local_100,(int *)&local_100);
      if ((float)(local_b0.
                  super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.num_elements -
                 local_b0.
                 super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 .ht_.rep.num_deleted) / (float)(ulong)local_f0._0_8_ <= local_b4) break;
      local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_b0.
                  super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                  .ht_.rep.num_buckets;
      testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                ((internal *)&local_e0,"bucket_count","ht.bucket_count()",(unsigned_long *)&local_f0
                 ,(unsigned_long *)&local_100);
      if ((char)local_e0.first.ht == '\0') {
        testing::Message::Message((Message *)&local_100);
        pcVar4 = "";
        if (local_e0.first.pos != (pointer)0x0) {
          pcVar4 = *(char **)local_e0.first.pos;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_c0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                   ,0x28e,pcVar4);
        testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_c0);
        if (local_100 !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_100 + 8))();
        }
      }
      piVar1 = local_e0.first.pos;
      if (local_e0.first.pos != (pointer)0x0) {
        if (*(pointer *)local_e0.first.pos != local_e0.first.pos + 4) {
          operator_delete(*(pointer *)local_e0.first.pos);
        }
        operator_delete(piVar1);
      }
    }
    local_100 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_b0.
                super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                .ht_.rep.num_buckets;
    testing::internal::CmpHelperLT<unsigned_long,unsigned_long>
              ((internal *)&local_e0,"ht.bucket_count()","bucket_count",(unsigned_long *)&local_100,
               (unsigned_long *)&local_f0);
    if ((char)local_e0.first.ht == '\0') {
      testing::Message::Message((Message *)&local_100);
      pcVar4 = "";
      if (local_e0.first.pos != (pointer)0x0) {
        pcVar4 = *(char **)local_e0.first.pos;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
                 ,0x290,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,(Message *)&local_100);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      if (local_100 !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_100 + 8))();
      }
    }
    piVar1 = local_e0.first.pos;
    if (local_e0.first.pos != (pointer)0x0) {
      if (*(pointer *)local_e0.first.pos != local_e0.first.pos + 4) {
        operator_delete(*(pointer *)local_e0.first.pos);
      }
      operator_delete(piVar1);
    }
    local_b0.
    super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c16658;
    if (local_b0.
        super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
        .ht_.rep.table != (pointer)0x0) {
      free(local_b0.
           super_BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           .ht_.rep.table);
    }
    local_e4 = local_e4 + 0.2;
  } while (local_e4 <= 0.8);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, LoadFactor) {
  const typename TypeParam::size_type kSize = 16536;
  // Check growing past various thresholds and then shrinking below
  // them.
  for (float grow_threshold = 0.2f; grow_threshold <= 0.8f;
       grow_threshold += 0.2f) {
    TypeParam ht;
    ht.set_deleted_key(this->UniqueKey(1));
    ht.max_load_factor(grow_threshold);
    ht.min_load_factor(0.0);
    EXPECT_EQ(grow_threshold, ht.max_load_factor());
    EXPECT_EQ(0.0, ht.min_load_factor());

    ht.resize(kSize);
    size_t bucket_count = ht.bucket_count();
    // Erase and insert an element to set consider_shrink = true,
    // which should not cause a shrink because the threshold is 0.0.
    ht.insert(this->UniqueObject(2));
    ht.erase(this->UniqueKey(2));
    for (int i = 2;; ++i) {
      ht.insert(this->UniqueObject(i));
      if (static_cast<float>(ht.size()) / bucket_count < grow_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_GT(ht.bucket_count(), bucket_count);
        break;
      }
    }
    // Now set a shrink threshold 1% below the current size and remove
    // items until the size falls below that.
    const float shrink_threshold =
        static_cast<float>(ht.size()) / ht.bucket_count() - 0.01f;

    // This time around, check the old set_resizing_parameters interface.
    ht.set_resizing_parameters(shrink_threshold, 1.0);
    EXPECT_EQ(1.0, ht.max_load_factor());
    EXPECT_EQ(shrink_threshold, ht.min_load_factor());

    bucket_count = ht.bucket_count();
    for (int i = 2;; ++i) {
      ht.erase(this->UniqueKey(i));
      // A resize is only triggered by an insert, so add and remove a
      // value every iteration to trigger the shrink as soon as the
      // threshold is passed.
      ht.erase(this->UniqueKey(i + 1));
      ht.insert(this->UniqueObject(i + 1));
      if (static_cast<float>(ht.size()) / bucket_count > shrink_threshold) {
        EXPECT_EQ(bucket_count, ht.bucket_count());
      } else {
        EXPECT_LT(ht.bucket_count(), bucket_count);
        break;
      }
    }
  }
}